

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::CheckCoapResponseCode
                  (Error *__return_storage_ptr__,Response *aResponse)

{
  Code CVar1;
  Code aCode;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view fmt;
  string local_190;
  string local_170;
  anon_class_1_0_00000001 local_14a;
  v10 local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  char *local_140;
  string local_138;
  Error local_118;
  undefined1 local_d9;
  Message *local_d8;
  Response *aResponse_local;
  Error *error;
  undefined1 local_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  local_d9 = 0;
  local_d8 = aResponse;
  aResponse_local = (Response *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  CVar1 = coap::Message::GetCode(local_d8);
  if (CVar1 != kChanged) {
    CheckCoapResponseCode::anon_class_1_0_00000001::operator()(&local_14a);
    local_58 = &local_148;
    local_60 = &local_149;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_140 = (char *)bVar2.size_;
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar2.data_;
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
              ();
    coap::Message::GetRequestUri_abi_cxx11_(&local_170,local_d8);
    CVar1 = coap::Message::GetCode(local_d8);
    coap::CodeToString_abi_cxx11_(&local_190,(coap *)(ulong)CVar1,aCode);
    local_68 = &local_138;
    local_78 = local_148;
    pcStack_70 = local_140;
    local_80 = &local_170;
    local_88 = &local_190;
    local_50 = &local_78;
    local_98 = local_148;
    local_90 = local_140;
    local_48 = local_98;
    pcStack_40 = local_90;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
              ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&error,(v10 *)local_80,local_88,local_148);
    local_30 = local_a8;
    local_38 = &error;
    local_20 = 0xdd;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0xdd;
    fmt.data_ = local_90;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_138,(v10 *)local_98,fmt,args);
    Error::Error(&local_118,kCoapError,&local_138);
    Error::operator=(__return_storage_ptr__,&local_118);
    Error::~Error(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_170);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::CheckCoapResponseCode(const coap::Response &aResponse)
{
    Error error = ERROR_NONE;

    VerifyOrExit(aResponse.GetCode() == coap::Code::kChanged,
                 error = ERROR_COAP_ERROR("request for {} failed: {}", aResponse.GetRequestUri(),
                                          coap::CodeToString(aResponse.GetCode())));

exit:
    return error;
}